

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  undefined4 *puVar1;
  ParamDictPrivate *pPVar2;
  int *piVar3;
  void *__ptr;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  void *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  long *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 local_38;
  
  lVar6 = 0x48;
  do {
    pPVar2 = this->d;
    puVar5 = (undefined8 *)((long)pPVar2->params + lVar6 + -0x40);
    *(undefined4 *)((long)pPVar2->params + lVar6 + -0x48) = 0;
    local_38 = 0;
    local_78 = (void *)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_58 = (long *)0x0;
    uStack_50 = 0;
    uStack_4c = 0;
    if ((void **)puVar5 != &local_78) {
      piVar3 = *(int **)((long)pPVar2->params + lVar6 + -0x38);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          __ptr = *(void **)((long)pPVar2->params + lVar6 + -0x40);
          plVar4 = *(long **)((long)pPVar2->params + lVar6 + -0x20);
          if (plVar4 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pPVar2->params[0].type + lVar6) = 0;
      *(undefined8 *)((long)pPVar2->params + lVar6 + -0x34) = 0;
      *(undefined8 *)((long)pPVar2->params + lVar6 + -0x2c) = 0;
      *puVar5 = 0;
      *(undefined8 *)((long)pPVar2->params + lVar6 + -0x38) = 0;
      puVar5 = (undefined8 *)((long)pPVar2->params + lVar6 + -0x18);
      *puVar5 = 0;
      puVar5[1] = 0;
      *(undefined4 *)((long)pPVar2->params + lVar6 + -8) = 0;
      *(void **)((long)pPVar2->params + lVar6 + -0x40) = local_78;
      piVar3 = (int *)CONCAT44(uStack_6c,uStack_70);
      *(int **)((long)pPVar2->params + lVar6 + -0x38) = piVar3;
      *(ulong *)((long)pPVar2->params + lVar6 + -0x30) = CONCAT44(uStack_64,local_68);
      *(undefined4 *)((long)pPVar2->params + lVar6 + -0x28) = local_60;
      *(long **)((long)pPVar2->params + lVar6 + -0x20) = local_58;
      puVar1 = (undefined4 *)((long)pPVar2->params + lVar6 + -0x18);
      *puVar1 = uStack_50;
      puVar1[1] = uStack_4c;
      puVar1[2] = uStack_48;
      puVar1[3] = (undefined4)uStack_44;
      *(undefined4 *)((long)pPVar2->params + lVar6 + -8) = uStack_44._4_4_;
      *(undefined8 *)((long)&pPVar2->params[0].type + lVar6) = local_38;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_58 == (long *)0x0) {
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (**(code **)(*local_58 + 0x18))();
          }
        }
      }
    }
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0xa48);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].v = Mat();
    }
}